

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

bool __thiscall
wasm::SimplifyLocals<false,_false,_true>::runMainOptimizations
          (SimplifyLocals<false,_false,_true> *this,Function *func)

{
  pointer ppBVar1;
  pointer ppIVar2;
  If *pIVar3;
  size_t sVar4;
  pointer ppLVar5;
  Loop *pLVar6;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  Expression *pEVar7;
  Block *pBVar8;
  iterator __begin3_1;
  pointer ppIVar9;
  pointer ppLVar10;
  iterator __begin3;
  pointer ppBVar11;
  _Storage<wasm::Type,_true> local_68;
  uint7 uStack_5f;
  _Storage<wasm::Type,_true> local_58;
  uint7 uStack_4f;
  _Storage<wasm::Type,_true> local_48;
  uint7 uStack_3f;
  Builder local_38;
  
  this->anotherCycle = false;
  Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
  ::walk((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
          *)&(this->
             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
             ).
             super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
         ,&func->body);
  ppBVar11 = (this->blocksToEnlarge).
             super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppBVar1 = (this->blocksToEnlarge).
            super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppBVar1 != ppBVar11) {
    do {
      pBVar8 = *ppBVar11;
      pEVar7 = (Expression *)
               MixedArena::allocSpace
                         (&((this->
                            super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                            ).
                            super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                            .
                            super_PostWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                            .
                            super_Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                           .currModule)->allocator,0x10,8);
      pEVar7->_id = NopId;
      (pEVar7->type).id = 0;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar8->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar7)
      ;
      ppBVar11 = ppBVar11 + 1;
    } while (ppBVar11 != ppBVar1);
    ppBVar11 = (this->blocksToEnlarge).
               super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->blocksToEnlarge).super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppBVar11) {
      (this->blocksToEnlarge).super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppBVar11;
    }
    this->anotherCycle = true;
  }
  ppIVar9 = (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppIVar2 = (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppIVar2 != ppIVar9) {
    do {
      pIVar3 = *ppIVar9;
      local_38.wasm =
           (this->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
           ).
           super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
           .
           super_PostWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
           .
           super_Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
           .currModule;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = (ulong)uStack_5f << 8;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = local_68;
      pBVar8 = Builder::blockifyWithName
                         (&local_38,pIVar3->ifTrue,(Name)ZEXT816(0),(Expression *)0x0,type);
      pIVar3->ifTrue = (Expression *)pBVar8;
      sVar4 = (pBVar8->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if ((sVar4 == 0) ||
         ((pBVar8->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          data[sVar4 - 1]->_id != NopId)) {
        pEVar7 = (Expression *)
                 MixedArena::allocSpace
                           (&((this->
                              super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                              ).
                              super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                              .
                              super_PostWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                              .
                              super_Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                             .currModule)->allocator,0x10,8);
        pEVar7->_id = NopId;
        (pEVar7->type).id = 0;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(pBVar8->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar7);
      }
      if (pIVar3->ifFalse != (Expression *)0x0) {
        local_38.wasm =
             (this->
             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
             ).
             super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
             .
             super_PostWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
             .
             super_Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
             .currModule;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = (ulong)uStack_4f << 8;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = local_58;
        pBVar8 = Builder::blockifyWithName
                           (&local_38,pIVar3->ifFalse,(Name)ZEXT816(0),(Expression *)0x0,type_00);
        pIVar3->ifFalse = (Expression *)pBVar8;
        sVar4 = (pBVar8->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements;
        if ((sVar4 == 0) ||
           ((pBVar8->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
            [sVar4 - 1]->_id != NopId)) {
          pEVar7 = (Expression *)
                   MixedArena::allocSpace
                             (&((this->
                                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                                ).
                                super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                                .
                                super_PostWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                                .
                                super_Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                               .currModule)->allocator,0x10,8);
          pEVar7->_id = NopId;
          (pEVar7->type).id = 0;
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(pBVar8->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     pEVar7);
        }
      }
      ppIVar9 = ppIVar9 + 1;
    } while (ppIVar9 != ppIVar2);
    ppIVar9 = (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar9) {
      (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar9;
    }
    this->anotherCycle = true;
  }
  ppLVar10 = (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar5 = (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar5 != ppLVar10) {
    do {
      pLVar6 = *ppLVar10;
      local_38.wasm =
           (this->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
           ).
           super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
           .
           super_PostWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
           .
           super_Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
           .currModule;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = (ulong)uStack_3f << 8;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = local_48;
      pBVar8 = Builder::blockifyWithName
                         (&local_38,pLVar6->body,(Name)ZEXT816(0),(Expression *)0x0,type_01);
      pLVar6->body = (Expression *)pBVar8;
      sVar4 = (pBVar8->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if ((sVar4 == 0) ||
         ((pBVar8->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          data[sVar4 - 1]->_id != NopId)) {
        pEVar7 = (Expression *)
                 MixedArena::allocSpace
                           (&((this->
                              super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                              ).
                              super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                              .
                              super_PostWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                              .
                              super_Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                             .currModule)->allocator,0x10,8);
        pEVar7->_id = NopId;
        (pEVar7->type).id = 0;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(pBVar8->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar7);
      }
      ppLVar10 = ppLVar10 + 1;
    } while (ppLVar10 != ppLVar5);
    ppLVar10 = (this->loopsToEnlarge).
               super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppLVar10) {
      (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>._M_impl
      .super__Vector_impl_data._M_finish = ppLVar10;
    }
    this->anotherCycle = true;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_true>::SinkableInfo>_>_>
  ::clear(&(this->sinkables)._M_t);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_true>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_true>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_true>::BlockBreak>_>_>_>_>
  ::clear(&(this->blockBreaks)._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::clear(&(this->unoptimizableBlocks)._M_t);
  return this->anotherCycle;
}

Assistant:

bool runMainOptimizations(Function* func) {
    anotherCycle = false;
    WalkerPass<LinearExecutionWalker<
      SimplifyLocals<allowTee, allowStructure, allowNesting>>>::
      doWalkFunction(func);
    // enlarge blocks that were marked, for the next round
    if (blocksToEnlarge.size() > 0) {
      for (auto* block : blocksToEnlarge) {
        block->list.push_back(
          this->getModule()->allocator.template alloc<Nop>());
      }
      blocksToEnlarge.clear();
      anotherCycle = true;
    }
    // enlarge ifs that were marked, for the next round
    if (ifsToEnlarge.size() > 0) {
      for (auto* iff : ifsToEnlarge) {
        auto ifTrue =
          Builder(*this->getModule()).blockifyWithName(iff->ifTrue, Name());
        iff->ifTrue = ifTrue;
        if (ifTrue->list.size() == 0 ||
            !ifTrue->list.back()->template is<Nop>()) {
          ifTrue->list.push_back(
            this->getModule()->allocator.template alloc<Nop>());
        }
        if (iff->ifFalse) {
          auto ifFalse =
            Builder(*this->getModule()).blockifyWithName(iff->ifFalse, Name());
          iff->ifFalse = ifFalse;
          if (ifFalse->list.size() == 0 ||
              !ifFalse->list.back()->template is<Nop>()) {
            ifFalse->list.push_back(
              this->getModule()->allocator.template alloc<Nop>());
          }
        }
      }
      ifsToEnlarge.clear();
      anotherCycle = true;
    }
    // enlarge loops that were marked, for the next round
    if (loopsToEnlarge.size() > 0) {
      for (auto* loop : loopsToEnlarge) {
        auto block =
          Builder(*this->getModule()).blockifyWithName(loop->body, Name());
        loop->body = block;
        if (block->list.size() == 0 ||
            !block->list.back()->template is<Nop>()) {
          block->list.push_back(
            this->getModule()->allocator.template alloc<Nop>());
        }
      }
      loopsToEnlarge.clear();
      anotherCycle = true;
    }
    // clean up
    sinkables.clear();
    blockBreaks.clear();
    unoptimizableBlocks.clear();
    return anotherCycle;
  }